

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_operation_node.cpp
# Opt level: O3

bool __thiscall duckdb::SetOperationNode::Equals(SetOperationNode *this,QueryNode *other_p)

{
  bool bVar1;
  int iVar2;
  SetOperationNode *pSVar3;
  pointer pQVar4;
  undefined8 extraout_RDX;
  
  bVar1 = QueryNode::Equals(&this->super_QueryNode,other_p);
  if (bVar1) {
    if (this == (SetOperationNode *)other_p) {
      return true;
    }
    pSVar3 = QueryNode::Cast<duckdb::SetOperationNode>(other_p);
    if ((this->setop_type == pSVar3->setop_type) && (this->setop_all == pSVar3->setop_all)) {
      pQVar4 = unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::
               operator->(&this->left);
      iVar2 = (*pQVar4->_vptr_QueryNode[4])
                        (pQVar4,(pSVar3->left).
                                super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>
                                ._M_t.
                                super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>
                                .super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl);
      if ((char)iVar2 != '\0') {
        pQVar4 = unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::
                 operator->(&this->right);
        iVar2 = (*pQVar4->_vptr_QueryNode[4])
                          (pQVar4,(pSVar3->right).
                                  super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>
                                  ._M_t.
                                  super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>
                                  .super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl,
                           extraout_RDX,pQVar4->_vptr_QueryNode[4]);
        return SUB41(iVar2,0);
      }
    }
  }
  return false;
}

Assistant:

bool SetOperationNode::Equals(const QueryNode *other_p) const {
	if (!QueryNode::Equals(other_p)) {
		return false;
	}
	if (this == other_p) {
		return true;
	}
	auto &other = other_p->Cast<SetOperationNode>();
	if (setop_type != other.setop_type) {
		return false;
	}
	if (setop_all != other.setop_all) {
		return false;
	}
	if (!left->Equals(other.left.get())) {
		return false;
	}
	if (!right->Equals(other.right.get())) {
		return false;
	}
	return true;
}